

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcompleter.cpp
# Opt level: O0

void QCompleter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QModelIndex *pQVar2;
  bool bVar3;
  QFlagsStorage<Qt::MatchFlag> QVar4;
  QCompleter *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QCompleterPrivate *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QCompleter *_t;
  QModelIndex *in_stack_ffffffffffffff08;
  CaseSensitivity cs;
  QCompleterPrivate *in_stack_ffffffffffffff10;
  QAbstractItemModel *in_stack_ffffffffffffff18;
  CompletionMode mode;
  QString *in_stack_ffffffffffffff20;
  QCompleterPrivate *in_stack_ffffffffffffff28;
  QCompleterPrivate *in_stack_ffffffffffffff30;
  QRect *in_stack_ffffffffffffff40;
  QCompleter *in_stack_ffffffffffffff48;
  QFlagsStorage<Qt::MatchFlag> *pQVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      activated((QCompleter *)in_stack_ffffffffffffff10,(QString *)in_stack_ffffffffffffff08);
      break;
    case 1:
      activated((QCompleter *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      break;
    case 2:
      highlighted((QCompleter *)in_stack_ffffffffffffff10,(QString *)in_stack_ffffffffffffff08);
      break;
    case 3:
      highlighted((QCompleter *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      break;
    case 4:
      setCompletionPrefix((QCompleter *)in_stack_ffffffffffffff30,
                          (QString *)in_stack_ffffffffffffff28);
      break;
    case 5:
      complete(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      break;
    case 6:
      QRect::QRect((QRect *)in_stack_ffffffffffffff10);
      complete(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff30 = in_RDI;
      break;
    case 7:
      setWrapAround((QCompleter *)in_stack_ffffffffffffff10,
                    SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
      break;
    case 8:
      d_func((QCompleter *)0xa7030b);
      pQVar2 = *(QModelIndex **)(in_RCX + 8);
      in_stack_ffffffffffffff08 = *(QModelIndex **)pQVar2;
      in_stack_ffffffffffffff10 = (QCompleterPrivate *)pQVar2->i;
      in_stack_ffffffffffffff18 = (pQVar2->m).ptr;
      QCompleterPrivate::_q_complete
                (in_stack_ffffffffffffff30,*pQVar2,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0)
                );
      break;
    case 9:
      d_func((QCompleter *)0xa70374);
      QCompleterPrivate::_q_completionSelected
                (in_stack_ffffffffffffff28,(QItemSelection *)in_stack_ffffffffffffff20);
      break;
    case 10:
      d_func((QCompleter *)0xa70397);
      QCompleterPrivate::_q_autoResizePopup(in_stack_ffffffffffffff10);
      break;
    case 0xb:
      d_func((QCompleter *)0xa703ae);
      QCompleterPrivate::_q_fileSystemModelDirectoryLoaded
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    }
  }
  QVar4.i = (Int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if ((in_ESI != 5) ||
     ((((bVar3 = QtMocHelpers::indexOfMethod<void(QCompleter::*)(QString_const&)>
                           (in_RCX,(void **)activated,0,0), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QCompleter::*)(QModelIndex_const&)>
                           (in_RCX,(void **)activated,0,1), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QCompleter::*)(QString_const&)>
                          (in_RCX,(void **)highlighted,0,2), !bVar3)) &&
      (bVar3 = QtMocHelpers::indexOfMethod<void(QCompleter::*)(QModelIndex_const&)>
                         (in_RCX,(void **)highlighted,0,3), !bVar3)))) {
    if (in_ESI == 1) {
      pQVar5 = *(QFlagsStorage<Qt::MatchFlag> **)in_RCX;
      in_stack_ffffffffffffff28 = (QCompleterPrivate *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff28) {
      case (QCompleterPrivate *)0x0:
        completionPrefix((QCompleter *)in_stack_ffffffffffffff18);
        QString::operator=((QString *)in_stack_ffffffffffffff10,(QString *)in_stack_ffffffffffffff08
                          );
        QString::~QString((QString *)0xa70549);
        break;
      case (QCompleterPrivate *)0x1:
        QVar4.i = modelSorting((QCompleter *)in_stack_ffffffffffffff10);
        pQVar5->i = QVar4.i;
        break;
      case (QCompleterPrivate *)0x2:
        QVar4.i = (Int)filterMode((QCompleter *)in_stack_ffffffffffffff10);
        pQVar5->i = QVar4.i;
        break;
      case (QCompleterPrivate *)0x3:
        QVar4.i = completionMode((QCompleter *)in_stack_ffffffffffffff10);
        pQVar5->i = QVar4.i;
        break;
      case (QCompleterPrivate *)0x4:
        QVar4.i = completionColumn((QCompleter *)in_stack_ffffffffffffff10);
        pQVar5->i = QVar4.i;
        break;
      case (QCompleterPrivate *)0x5:
        QVar4.i = completionRole((QCompleter *)in_stack_ffffffffffffff10);
        pQVar5->i = QVar4.i;
        break;
      case (QCompleterPrivate *)0x6:
        QVar4.i = maxVisibleItems((QCompleter *)in_stack_ffffffffffffff10);
        pQVar5->i = QVar4.i;
        break;
      case (QCompleterPrivate *)0x7:
        QVar4.i = caseSensitivity((QCompleter *)in_stack_ffffffffffffff10);
        pQVar5->i = QVar4.i;
        break;
      case (QCompleterPrivate *)0x8:
        bVar3 = wrapAround((QCompleter *)in_stack_ffffffffffffff10);
        *(bool *)&pQVar5->i = bVar3;
      }
      QVar4.i = (Int)((ulong)pQVar5 >> 0x20);
    }
    if (in_ESI == 2) {
      this = (QCompleter *)(ulong)in_EDX;
      cs = (CaseSensitivity)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      mode = (CompletionMode)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      switch(this) {
      case (QCompleter *)0x0:
        setCompletionPrefix((QCompleter *)in_stack_ffffffffffffff30,
                            (QString *)in_stack_ffffffffffffff28);
        break;
      case (QCompleter *)0x1:
        setModelSorting((QCompleter *)in_stack_ffffffffffffff10,cs);
        break;
      case (QCompleter *)0x2:
        setFilterMode((QCompleter *)in_stack_ffffffffffffff10,(MatchFlags)QVar4.i);
        break;
      case (QCompleter *)0x3:
        setCompletionMode(this,mode);
        break;
      case (QCompleter *)0x4:
        setCompletionColumn(this,mode);
        break;
      case (QCompleter *)0x5:
        setCompletionRole((QCompleter *)in_stack_ffffffffffffff10,cs);
        break;
      case (QCompleter *)0x6:
        setMaxVisibleItems((QCompleter *)in_stack_ffffffffffffff18,
                           (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
        break;
      case (QCompleter *)0x7:
        setCaseSensitivity((QCompleter *)in_stack_ffffffffffffff10,cs);
        break;
      case (QCompleter *)0x8:
        setWrapAround((QCompleter *)in_stack_ffffffffffffff10,
                      SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCompleter *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->setCompletionPrefix((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->complete((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1]))); break;
        case 6: _t->complete(); break;
        case 7: _t->setWrapAround((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->d_func()->_q_complete((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 9: _t->d_func()->_q_completionSelected((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1]))); break;
        case 10: _t->d_func()->_q_autoResizePopup(); break;
        case 11: _t->d_func()->_q_fileSystemModelDirectoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QString & )>(_a, &QCompleter::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QModelIndex & )>(_a, &QCompleter::activated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QString & )>(_a, &QCompleter::highlighted, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QModelIndex & )>(_a, &QCompleter::highlighted, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->completionPrefix(); break;
        case 1: *reinterpret_cast<ModelSorting*>(_v) = _t->modelSorting(); break;
        case 2: *reinterpret_cast<Qt::MatchFlags*>(_v) = _t->filterMode(); break;
        case 3: *reinterpret_cast<CompletionMode*>(_v) = _t->completionMode(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->completionColumn(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->completionRole(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->maxVisibleItems(); break;
        case 7: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->caseSensitivity(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->wrapAround(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCompletionPrefix(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setModelSorting(*reinterpret_cast<ModelSorting*>(_v)); break;
        case 2: _t->setFilterMode(*reinterpret_cast<Qt::MatchFlags*>(_v)); break;
        case 3: _t->setCompletionMode(*reinterpret_cast<CompletionMode*>(_v)); break;
        case 4: _t->setCompletionColumn(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setCompletionRole(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setMaxVisibleItems(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 8: _t->setWrapAround(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}